

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UBool __thiscall icu_63::RegexMatcher::matches(RegexMatcher *this,UErrorCode *status)

{
  UText *pUVar1;
  UBool UVar2;
  int64_t iVar3;
  
  if (U_ZERO_ERROR < *status) {
    return '\0';
  }
  if (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fInputUniStrMaybeMutable == '\0') {
      resetPreserveRegion(this);
    }
    else {
      UVar2 = compat_SyncMutableUTextContents(this->fInputText);
      if (UVar2 != '\0') {
        iVar3 = utext_nativeLength_63(this->fInputText);
        this->fInputLength = iVar3;
        reset(this);
      }
    }
    pUVar1 = this->fInputText;
    if (((pUVar1->chunkNativeStart == 0) && (this->fInputLength == pUVar1->chunkNativeLimit)) &&
       (this->fInputLength == (long)pUVar1->nativeIndexingLimit)) {
      MatchChunkAt(this,(int32_t)this->fActiveStart,'\x01',status);
    }
    else {
      MatchAt(this,this->fActiveStart,'\x01',status);
    }
    UVar2 = this->fMatch;
  }
  else {
    *status = this->fDeferredStatus;
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }